

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t c4::yml::anon_unknown_0::_count_resolved_tags_size(Tree *t,size_t node)

{
  NodeType_e NVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  csubstr *pcVar5;
  size_t sVar6;
  size_t sVar7;
  
  sVar4 = Tree::first_child(t,node);
  if (sVar4 == 0xffffffffffffffff) {
    sVar7 = 0;
  }
  else {
    sVar7 = 0;
    do {
      if (t->m_cap <= sVar4) {
        if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          sVar4 = (*pcVar2)();
          return sVar4;
        }
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((t->m_buf[sVar4].m_type.type & KEY) != NOTYPE) {
        if (t->m_cap <= sVar4) {
          if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            sVar4 = (*pcVar2)();
            return sVar4;
          }
          (*(code *)PTR_error_impl_0023e4c8)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((~(int)t->m_buf[sVar4].m_type.type & 0x402U) == 0) {
          pcVar5 = Tree::key_tag(t,sVar4);
          sVar6 = Tree::resolve_tag(t,(substr)ZEXT816(0),*pcVar5,sVar4);
          sVar7 = sVar7 + sVar6;
        }
      }
      if (t->m_cap <= sVar4) {
        if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          sVar4 = (*pcVar2)();
          return sVar4;
        }
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((t->m_buf[sVar4].m_type.type & VAL) != NOTYPE) {
        if (t->m_cap <= sVar4) {
          if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            sVar4 = (*pcVar2)();
            return sVar4;
          }
          (*(code *)PTR_error_impl_0023e4c8)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        NVar1 = t->m_buf[sVar4].m_type.type;
        if ((NVar1 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar1 >> 0xb & 1) != 0) {
          pcVar5 = Tree::val_tag(t,sVar4);
          sVar6 = Tree::resolve_tag(t,(substr)ZEXT816(0),*pcVar5,sVar4);
          sVar7 = sVar7 + sVar6;
        }
      }
      sVar6 = _count_resolved_tags_size(t,sVar4);
      sVar7 = sVar6 + sVar7;
      sVar4 = Tree::next_sibling(t,sVar4);
    } while (sVar4 != 0xffffffffffffffff);
  }
  return sVar7;
}

Assistant:

size_t _count_resolved_tags_size(Tree const* t, size_t node)
{
    size_t sz = 0;
    for(size_t child = t->first_child(node); child != NONE; child = t->next_sibling(child))
    {
        if(t->has_key(child) && t->has_key_tag(child))
            sz += t->resolve_tag(substr{}, t->key_tag(child), child);
        if(t->has_val(child) && t->has_val_tag(child))
            sz += t->resolve_tag(substr{}, t->val_tag(child), child);
        sz += _count_resolved_tags_size(t, child);
    }
    return sz;
}